

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O2

void __thiscall CChat::CChat(CChat *this)

{
  EVP_PKEY_CTX *in_RSI;
  
  (this->super_CComponent)._vptr_CComponent = (_func_int **)&PTR__CChat_00206b98;
  CLineInput::CLineInput(&this->m_Input);
  TStaticRingBuffer<CChat::CHistoryEntry,_65536,_1>::Init(&this->m_History);
  array<bool,_allocator_default<bool>_>::init(&this->m_aFilter,in_RSI);
  CCommandManager::CCommandManager(&this->m_CommandManager);
  this->m_aInputBuf[0] = '\0';
  CLineInput::SetBuffer(&this->m_Input,this->m_aInputBuf,0x200);
  return;
}

Assistant:

CChat::CChat()
{
	m_aInputBuf[0] = '\0';
	m_Input.SetBuffer(m_aInputBuf, sizeof(m_aInputBuf));
}